

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

void __thiscall Jzon::Node::add(Node *this,Node *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Data *pDVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
  local_48;
  
  if ((this->data != (Data *)0x0) && (this->data->type == T_ARRAY)) {
    detach(this);
    pDVar2 = this->data;
    paVar1 = &local_48.first.field_2;
    local_48.first.field_2._M_local_buf[0] = '\0';
    local_48.first._M_string_length = 0;
    local_48.second = (Node)node->data;
    if (local_48.second.data != (Data *)0x0) {
      (local_48.second.data)->refCount = (local_48.second.data)->refCount + 1;
    }
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
    std::
    vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
    ::emplace_back<std::pair<std::__cxx11::string,Jzon::Node>>
              ((vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
                *)&pDVar2->children,&local_48);
    ~Node(&local_48.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.first._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Node::add(const Node &node)
	{
		if (isArray())
		{
			detach();
			data->children.push_back(std::make_pair(std::string(), node));
		}
	}